

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O1

void rlib::string::inner::
     f<char,int_const,std::__cxx11::string&,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const&>
               (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *format,int *head,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail,
               vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *tail_1)

{
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  put_holder<char,_std::char_traits<char>_> local_30;
  
  local_30.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,int_const>;
  local_30.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,int_const>;
  local_30.arg = head;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (format,&local_30);
  local_30.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string>;
  local_30.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string>;
  local_30.arg = tail;
  pbVar1 = boost::io::detail::
           feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                     (pbVar1,&local_30);
  f<char,std::vector<rlib::JsonT<void>,std::allocator<rlib::JsonT<void>>>const>(pbVar1,tail_1);
  return;
}

Assistant:

void f(boost::basic_format<CharT>& format, Head& head, Tail&&... tail) {
				using HeadT = std::remove_const_t<Head>;
				if constexpr (IsUniquePtr<HeadT>::value || IsSharedPtr<HeadT>::value || IsOptional<HeadT>::value) {
					if (head) {
						f<CharT>(format, *head, tail...);
					} else {
						f<CharT>(format % "(null)", tail...);
					}
				} else if constexpr (IsPair<HeadT>::value) {
					f<CharT>(format, head.first, head.second, tail...);
				} else if constexpr (IsTuple<HeadT>::value) {
					f<0, CharT>(format, head, tail...);
				} else if constexpr (IsArray<HeadT>::value || IsVector<HeadT>::value || IsList<HeadT>::value || IsDeque<HeadT>::value
					|| IsInitializerList<HeadT>::value || IsSet<HeadT>::value || IsMultiSet<HeadT>::value
					|| IsMap<HeadT>::value || IsMultiMap<HeadT>::value)		// 範囲ループ可の型か？っていう便利記述がもしあるなら知りたい
				{
					for (const auto& i : head) {
						f<CharT>(format, i);
					}
					f<CharT>(format, tail...);
#if defined(_MSC_VER) && defined(AFX_EXT_CLASS)
				} else if constexpr (std::is_same_v<HeadT, CStringA> || std::is_same_v<HeadT, CStringW>) {
					f<CharT>(format % std::basic_string<CharT>(head.GetString()), tail...);
#endif
				} else {
					f<CharT>(format % head, tail...);
				}
			}